

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_checkOutBuffer(ZSTD_DStream *zds,ZSTD_outBuffer *output)

{
  ZSTD_outBuffer expect;
  ZSTD_outBuffer *output_local;
  ZSTD_DStream *zds_local;
  
  if (zds->outBufferMode == ZSTD_bm_stable) {
    if (zds->streamStage == zdss_init) {
      zds_local = (ZSTD_DStream *)0x0;
    }
    else if ((((zds->expectedOutBuffer).dst == output->dst) &&
             ((zds->expectedOutBuffer).pos == output->pos)) &&
            ((zds->expectedOutBuffer).size == output->size)) {
      zds_local = (ZSTD_DStream *)0x0;
    }
    else {
      zds_local = (ZSTD_DStream *)0xffffffffffffff98;
    }
  }
  else {
    zds_local = (ZSTD_DStream *)0x0;
  }
  return (size_t)zds_local;
}

Assistant:

static size_t ZSTD_checkOutBuffer(ZSTD_DStream const* zds, ZSTD_outBuffer const* output)
{
    ZSTD_outBuffer const expect = zds->expectedOutBuffer;
    /* No requirement when ZSTD_obm_stable is not enabled. */
    if (zds->outBufferMode != ZSTD_bm_stable)
        return 0;
    /* Any buffer is allowed in zdss_init, this must be the same for every other call until
     * the context is reset.
     */
    if (zds->streamStage == zdss_init)
        return 0;
    /* The buffer must match our expectation exactly. */
    if (expect.dst == output->dst && expect.pos == output->pos && expect.size == output->size)
        return 0;
    RETURN_ERROR(dstBuffer_wrong, "ZSTD_d_stableOutBuffer enabled but output differs!");
}